

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

char * rtosc_skip_next_printed_arg
                 (char *src,int *skipped,char *type,char *llhssrc,int follow_ellipsis,
                 int inside_bundle)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int32_t iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  rtosc_arg_val_t *rhsarg_00;
  byte bVar11;
  _func_int_int *property;
  char *pcVar12;
  bool bVar13;
  char *local_e8;
  _func_int_int *local_e0;
  char deltaless_range_type;
  int local_d0;
  char rhstype [2];
  char llhstype;
  char dummy;
  char *local_b8;
  char *local_b0;
  size_t zero;
  char arraytype_cur;
  undefined3 uStack_9f;
  int skipped2;
  void *local_70;
  int rhsskipped;
  int llhsskipped;
  rtosc_arg_val_t rhsarg;
  rtosc_arg_val_t delta;
  
  local_b0 = (char *)CONCAT44(local_b0._4_4_,follow_ellipsis);
  local_e0 = (_func_int_int *)&dummy;
  if (type != (char *)0x0) {
    local_e0 = (_func_int_int *)type;
  }
  *skipped = 1;
  deltaless_range_type = '\0';
  cVar2 = *src;
  local_e8 = src;
  local_b8 = llhssrc;
  if (cVar2 == '\"') {
    bVar13 = false;
    pcVar8 = src + 1;
    local_d0 = inside_bundle;
    while (cVar2 = *pcVar8, cVar2 != '\0') {
      if ((bool)((bVar13 ^ 1U) & cVar2 == '\"')) {
        _skipped2 = pcVar8;
        if (pcVar8[1] != '\\') {
          local_e8 = pcVar8 + 1;
          if (pcVar8[1] != 'S') goto LAB_0010cd61;
          *local_e0 = (_func_int_int)0x53;
          llhssrc = local_b8;
          inside_bundle = local_d0;
          local_e8 = pcVar8 + 2;
          goto LAB_0010cfe6;
        }
        skip_fmt_null((char **)&skipped2,"\"\\ \"%n");
        bVar13 = false;
        pcVar8 = _skipped2;
      }
      else {
        if ((bVar13) && (cVar1 = get_escaped_char(cVar2,0), cVar1 == '\0')) break;
        bVar13 = (bool)(cVar2 == '\\' & (bVar13 ^ 1U));
        pcVar8 = pcVar8 + 1;
      }
    }
    local_e8 = (char *)0x0;
LAB_0010cd61:
    *local_e0 = (_func_int_int)0x73;
    llhssrc = local_b8;
    inside_bundle = local_d0;
  }
  else if (cVar2 == '#') {
    ppuVar5 = __ctype_b_loc();
    pcVar8 = src;
    uVar10 = 0;
    while (uVar10 < 8) {
      pcVar12 = pcVar8 + 1;
      pcVar8 = pcVar8 + 1;
      uVar10 = uVar10 + 1;
      if ((*(byte *)((long)*ppuVar5 + (long)*pcVar12 * 2 + 1) & 0x10) == 0) {
        pcVar8 = (char *)0x0;
        uVar10 = 9;
      }
    }
    local_e8 = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      local_e8 = (char *)0x0;
    }
    *local_e0 = (_func_int_int)0x72;
  }
  else if (cVar2 == '\'') {
    sVar7 = strlen(src);
    if (sVar7 < 3) {
      return (char *)0x0;
    }
    pcVar8 = src;
    if ((src[1] == '\\') &&
       ((cVar2 = src[2], cVar2 != '\'' ||
        ((cVar1 = src[3], (long)cVar1 != 0 &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0))
        )))) {
      cVar2 = get_escaped_char(cVar2,1);
      if (cVar2 != '\0') {
        pcVar8 = src + 1;
        goto LAB_0010cd3b;
      }
      local_e8 = (char *)0x0;
    }
    else {
LAB_0010cd3b:
      local_e8 = (char *)0x0;
      if (pcVar8[2] == '\'') {
        local_e8 = pcVar8 + 3;
      }
    }
    *local_e0 = (_func_int_int)0x63;
  }
  else if (cVar2 == 'B') {
    skip_fmt_null(&local_e8,"BLOB [ %n");
    pcVar8 = local_e8;
    if (local_e8 == (char *)0x0) {
      *local_e0 = (_func_int_int)0x53;
      local_e8 = skip_identifier(src);
    }
    else {
      *local_e0 = (_func_int_int)0x62;
      _skipped2 = (char *)((ulong)_skipped2 & 0xffffffff00000000);
      _arraytype_cur = 0;
      __isoc99_sscanf(local_e8,"%i %n",&arraytype_cur,&skipped2);
      local_e8 = pcVar8 + skipped2;
      if ((long)skipped2 == 0) {
        local_e8 = (char *)0x0;
      }
      while (local_e8 != (char *)0x0) {
        if (*local_e8 != '0') {
          if (_arraytype_cur != 0) goto LAB_0010cf4a;
          cVar2 = *local_e8;
          pcVar8 = local_e8 + 1;
          local_e8 = (char *)0x0;
          if (cVar2 == ']') {
            local_e8 = pcVar8;
          }
          goto LAB_0010cfe6;
        }
        skip_fmt_null(&local_e8,"0x%*x %n");
        _arraytype_cur = _arraytype_cur + -1;
      }
      if (_arraytype_cur != 0) {
LAB_0010cf4a:
        local_e8 = (char *)0x0;
      }
    }
  }
  else if (cVar2 == 'M') {
    iVar3 = strncmp("MIDI",src,4);
    pcVar8 = src;
    if (iVar3 == 0) {
      ppuVar5 = __ctype_b_loc();
      if (((long)src[4] == 0x5b) || (((*ppuVar5)[src[4]] & 0x2000) != 0)) {
        skip_fmt_null(&local_e8,"MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n");
        *local_e0 = (_func_int_int)0x6d;
        goto LAB_0010cfe6;
      }
    }
LAB_0010cdb4:
    local_e8 = skip_identifier(pcVar8);
    *local_e0 = (_func_int_int)0x53;
  }
  else if (cVar2 == 't') {
    pcVar12 = skip_word("true",&local_e8);
    pcVar8 = local_e8;
    if (pcVar12 == (char *)0x0) goto LAB_0010cdb4;
    *local_e0 = (_func_int_int)0x54;
  }
  else if (cVar2 == 'f') {
    pcVar12 = skip_word("false",&local_e8);
    pcVar8 = local_e8;
    if (pcVar12 == (char *)0x0) goto LAB_0010cdb4;
    *local_e0 = (_func_int_int)0x46;
  }
  else if (cVar2 == 'i') {
    pcVar8 = skip_word("inf",&local_e8);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "immediately";
LAB_0010cd93:
      pcVar12 = skip_word(pcVar8,&local_e8);
      pcVar8 = local_e8;
      if (pcVar12 == (char *)0x0) goto LAB_0010cdb4;
LAB_0010cda2:
      *local_e0 = (_func_int_int)0x74;
    }
    else {
      *local_e0 = (_func_int_int)0x49;
    }
  }
  else if (cVar2 == 'n') {
    pcVar8 = skip_word("nil",&local_e8);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "now";
      goto LAB_0010cd93;
    }
    *local_e0 = (_func_int_int)0x4e;
  }
  else if (cVar2 == '[') {
    local_d0 = inside_bundle;
    ppuVar5 = __ctype_b_loc();
    local_e8 = src;
    do {
      pcVar8 = local_e8 + 1;
      local_e8 = local_e8 + 1;
    } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
    pcVar8 = (char *)0x0;
    pcVar12 = local_e8;
    cVar2 = '\0';
    while ((pcVar12 != (char *)0x0 && (*pcVar12 != '\0'))) {
      if (*pcVar12 == ']') {
        local_e8 = pcVar12 + 1;
        goto LAB_0010cf19;
      }
      _arraytype_cur = CONCAT31(uStack_9f,0x14);
      pcVar6 = rtosc_skip_next_printed_arg(pcVar12,&skipped2,&arraytype_cur,pcVar8,1,1);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = pcVar6 + -1;
        do {
          pcVar8 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
        } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
      }
      cVar1 = arraytype_cur;
      if ((cVar2 != '\0') &&
         (iVar3 = arraytypes_match(cVar2,arraytype_cur), cVar1 = cVar2, iVar3 == 0)) {
        pcVar6 = (char *)0x0;
      }
      *skipped = *skipped + skipped2;
      pcVar8 = pcVar12;
      pcVar12 = pcVar6;
      cVar2 = cVar1;
    }
    local_e8 = (char *)0x0;
LAB_0010cf19:
    *local_e0 = (_func_int_int)0x61;
    llhssrc = local_b8;
    inside_bundle = local_d0;
  }
  else {
    iVar3 = is_range_multiplier(src);
    if (iVar3 == 0) {
      pcVar8 = src;
      if ((cVar2 == '_') ||
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 4) != 0)) {
        while ((cVar2 == '_' || (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[cVar2] & 8) != 0))) {
          cVar2 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        }
        *local_e0 = (_func_int_int)0x53;
        local_e8 = pcVar8;
      }
      else {
        iVar3 = skip_fmt(&local_e8,"%*4d-%*1d%*1d-%*1d%*1d%n");
        if (iVar3 != 0) {
          iVar3 = skip_fmt(&local_e8," %*2d:%*1d%*1d%n");
          if ((((iVar3 != 0) && (iVar3 = skip_fmt(&local_e8,":%*1d%*1d%n"), iVar3 != 0)) &&
              (iVar3 = skip_fmt(&local_e8,".%*d%n"), iVar3 != 0)) &&
             (iVar3 = skip_fmt(&local_e8," ( ... + 0x%n"), iVar3 != 0)) {
            skip_fmt(&local_e8,"%*x.%n");
            iVar3 = skip_fmt(&local_e8,"%*xp%n");
            pcVar8 = local_e8;
            if (iVar3 == 0) {
              local_e8 = (char *)0x0;
            }
            else {
              _skipped2 = (char *)((ulong)_skipped2 & 0xffffffff00000000);
              __isoc99_sscanf(local_e8,"-%d s )%n",&arraytype_cur,&skipped2);
              local_e8 = (char *)0x0;
              if (_arraytype_cur - 1U < 0x20) {
                local_e8 = pcVar8 + skipped2;
              }
              if ((long)skipped2 == 0) {
                local_e8 = (char *)0x0;
              }
            }
          }
          goto LAB_0010cda2;
        }
        property = local_e0;
        sVar9 = skip_numeric(&local_e8,(char *)local_e0);
        if (sVar9 != 0) {
          _skipped2 = local_e8;
          skip_while((char **)&skipped2,property);
          if (*_skipped2 != '(') goto LAB_0010cfe6;
          if (((byte)*local_e0 | 2) == 0x66) {
            local_e8 = _skipped2 + 1;
            skip_while(&local_e8,property);
            sVar9 = skip_numeric(&local_e8,(char *)0x0);
            if (sVar9 != 0) {
              skip_fmt_null(&local_e8," )%n");
              goto LAB_0010cfe6;
            }
          }
        }
        local_e8 = (char *)0x0;
      }
    }
    else {
      local_e8 = src + 1;
      do {
        cVar2 = *local_e8;
        local_e8 = local_e8 + 1;
      } while (cVar2 != 'x');
      local_e8 = rtosc_skip_next_printed_arg
                           (local_e8,&skipped2,&deltaless_range_type,(char *)0x0,0,inside_bundle);
      if (local_e8 != (char *)0x0) {
        *local_e0 = (_func_int_int)0x2d;
        *skipped = *skipped + skipped2;
      }
    }
  }
LAB_0010cfe6:
  pcVar8 = local_e8;
  if (local_e8 == (char *)0x0 || (int)local_b0 == 0) {
    return local_e8;
  }
  local_b8 = llhssrc;
  ppuVar5 = __ctype_b_loc();
  pcVar12 = pcVar8 + 1;
  do {
    pcVar6 = pcVar12;
    pcVar12 = pcVar6 + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)pcVar6[-1] * 2 + 1) & 0x20) != 0);
  if (pcVar6[-1] != '.') {
    return pcVar8;
  }
  if (*pcVar6 != '.') {
    return pcVar8;
  }
  if (*pcVar12 != '.') {
    return pcVar8;
  }
  local_e8 = (char *)0x0;
  iVar3 = is_range_multiplier(src);
  if (iVar3 != 0) {
    pcVar8 = strchr(src,0x78);
    src = pcVar8 + 1;
  }
  bVar11 = deltaless_range_type;
  if (deltaless_range_type == '\0') {
    bVar11 = (byte)*local_e0;
  }
  local_b0 = pcVar6 + -1;
  rhstype[0] = 'x';
  rhstype[1] = '\0';
  *local_e0 = (_func_int_int)0x2d;
  zero = 0;
  do {
    cVar2 = pcVar12[1];
    pcVar12 = pcVar12 + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  local_e0 = (_func_int_int *)CONCAT44(local_e0._4_4_,(int)(char)bVar11);
  local_d0 = inside_bundle;
  local_70 = memchr("cihfdTF",(int)(char)bVar11,8);
  if (cVar2 == ']') {
    rhstype[0] = bVar11;
    pcVar8 = pcVar12;
    if (local_70 != (void *)0x0) goto LAB_0010d150;
  }
  else {
    if (local_70 == (void *)0x0) {
      return local_e8;
    }
    pcVar8 = rtosc_skip_next_printed_arg(pcVar12,&rhsskipped,rhstype,(char *)0x0,0,local_d0);
    if (pcVar8 == (char *)0x0) {
      return local_e8;
    }
    rtosc_scan_arg_val(pcVar12,&rhsarg,1,(char *)0x0,&zero,0,0);
    if (bVar11 != rhstype[0]) {
      return local_e8;
    }
LAB_0010d150:
    rtosc_scan_arg_val(src,(rtosc_arg_val_t *)&arraytype_cur,1,(char *)0x0,&zero,0,0);
    pcVar12 = pcVar8;
  }
  pcVar8 = local_b8;
  bVar13 = true;
  if (local_b8 != (char *)0x0) {
    pcVar6 = strstr(local_b8,"...");
    if (pcVar6 < local_b0) {
      pcVar8 = pcVar6 + 2;
      do {
        pcVar6 = pcVar8 + 1;
        pcVar8 = pcVar8 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
    }
    else {
      iVar3 = is_range_multiplier(pcVar8);
      if (iVar3 != 0) {
        pcVar8 = strchr(pcVar8,0x78);
        pcVar8 = pcVar8 + 1;
      }
    }
    rtosc_skip_next_printed_arg(pcVar8,&llhsskipped,&llhstype,(char *)0x0,0,local_d0);
    iVar3 = types_match(llhstype,(char)local_e0);
    if (iVar3 != 0) {
      rtosc_scan_arg_val(pcVar8,(rtosc_arg_val_t *)&skipped2,1,(char *)0x0,&zero,0,0);
      iVar3 = rtosc_arg_vals_cmp_single
                        ((rtosc_arg_val_t *)&skipped2,(rtosc_arg_val_t *)&arraytype_cur,
                         (rtosc_cmp_options *)0x0);
      bVar13 = iVar3 == 0;
    }
  }
  if (cVar2 == ']') {
    if (local_70 == (void *)0x0 || bVar13 != false) {
      iVar3 = *skipped;
      goto LAB_0010d2a4;
    }
    rhsarg_00 = (rtosc_arg_val_t *)0x0;
  }
  else {
    rhsarg_00 = &rhsarg;
  }
  iVar4 = delta_from_arg_vals((rtosc_arg_val_t *)&skipped2,(rtosc_arg_val_t *)&arraytype_cur,
                              rhsarg_00,&delta,(uint)bVar13);
  if ((cVar2 != ']') && (iVar4 == -1)) {
    return local_e8;
  }
  iVar3 = (uint)(iVar4 != -1) + *skipped;
LAB_0010d2a4:
  *skipped = iVar3 + 1;
  return pcVar12;
}

Assistant:

const char* rtosc_skip_next_printed_arg(const char* src, int* skipped,
                                        char* type, const char* llhssrc,
                                        int follow_ellipsis, int inside_bundle)
{
    char dummy;
    if(!type)
        type = &dummy;
    assert(skipped);
    assert(src);
    *skipped = 1; // in almost all cases

    char deltaless_range_type = 0;

    const char* old_src = src;
    switch(*src)
    {
        case 't':
            if(skip_word("true", &src))
                *type = 'T';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'f':
            if(skip_word("false", &src))
                *type = 'F';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'n':
            if(skip_word("nil", &src))
                *type = 'N';
            else if(skip_word("now", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'i':
            if(skip_word("inf", &src))
                *type = 'I';
            else if(skip_word("immediately", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '#':
            for(size_t i = 0; i<8; ++i)
            {
                ++src;
                if(!isxdigit(*src)) {
                    src = NULL;
                    i = 8;
                }
            }
            if(src) ++src;
            *type = 'r';
            break;
        case '\'':
        {
            int esc = -1;
            if(strlen(src) < 3)
                return NULL;
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\' => mistyped backslash
            if(src[1] == '\\') {
                if(src[2] == '\'' && (!src[3] || isspace(src[3])))
                {
                    // type 4
                    // the user inputs '\', which is wrong, but
                    // we accept it as a backslash anyways
                }
                else
                {
                    ++src; // type 2 or 3
                    esc = get_escaped_char(src[1], 1);
                }
            }
            // if the last char was no single quote,
            // or we had an invalid escape sequence, return NULL
            src = (!esc || src[2] != '\'') ? NULL : (src + 3);
            *type = 'c';
            break;
        }
        case '"':
            src = end_of_printed_string(src);
            if(src && *src == 'S') {
                ++src;
                *type = 'S';
            }
            else
                *type = 's';
            break;
        case 'M':
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                skip_fmt_null(&src, "MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n");
                *type = 'm';
            }
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '[':
        {
            while(isspace(*++src));
            char arraytype = 0;
            const char* recent_src = NULL;
            while(src && *src && *src != ']')
            {
                char arraytype_cur = 20;
                int skipped2;
                const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped2,
                                                                 &arraytype_cur,
                                                                 recent_src, 1,
                                                                 true);
                recent_src = src;
                src = newsrc;

                if(src)
                    for( ; isspace(*src); ++src) ;
                if(!arraytype)
                    arraytype = arraytype_cur;
                else if(!arraytypes_match(arraytype, arraytype_cur))
                    src = NULL;
                *skipped += skipped2;
            }
            if(src)
            {
                if(*src) // => ']'
                    ++src;
                else
                    src = NULL;
            }
            *type = 'a';
            break;
        }
        case 'B':
        {
            const char* oldsrc = src;
            skip_fmt_null(&src, "BLOB [ %n");
            if(src)
            {
                *type = 'b';
                int rd = 0, blobsize = 0;
                sscanf(src, "%i %n", &blobsize, &rd);
                src = rd ? (src + rd) : NULL;
                for(;src && *src == '0';) // i.e. 0x...
                {
                    skip_fmt_null(&src, "0x%*x %n");
                    blobsize--;
                }
                if(blobsize)
                    src = NULL;
                if(src)
                    src = (*src == ']') ? (src + 1) : NULL;
            }
            else
            {
                *type = 'S';
                src = skip_identifier(oldsrc);
            }
            break;
        }
        default:
        {
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                while(*++src != 'x') ;
                ++src;

                int skipped2;
                src = rtosc_skip_next_printed_arg(src, &skipped2,
                                                  &deltaless_range_type,
                                                  NULL, 0, inside_bundle);
                if(src) {
                    *type = '-';
                    *skipped += skipped2;
                }
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                for(; *src == '_' || isalnum(*src); ++src) ;
                *type = 'S';
            }
            // is it a date? (vs a numeric)
            else if(skip_fmt(&src, "%*4d-%*1d%*1d-%*1d%*1d%n"))
            {
                if(skip_fmt(&src, " %*2d:%*1d%*1d%n"))
                if(skip_fmt(&src, ":%*1d%*1d%n"))
                if(skip_fmt(&src, ".%*d%n"))
                {
                    if(skip_fmt(&src, " ( ... + 0x%n"))
                    {
                        skip_fmt(&src, "%*x.%n");
                        if(skip_fmt(&src, "%*xp%n"))
                        {
                            int rd = 0, expm;
                            sscanf(src, "-%d s )%n", &expm, &rd);
                            if(rd && expm > 0 && expm <= 32)
                            {
                                // ok
                                src += rd;
                            }
                            else
                                src = NULL;

                        }
                        else
                            src = NULL;
                    }
                }
                *type = 't';
            }
            else
            {
                int rd = skip_numeric(&src, type);
                if(!rd) { src = NULL; break; }
                const char* after_num = src;
                skip_while(&after_num, isspace);
                if(*after_num == '(')
                {
                    if (*type == 'f' || *type == 'd')
                    {
                        // skip lossless representation
                        src = ++after_num;
                        skip_while(&src, isspace);
                        rd = skip_numeric(&src, NULL);
                        if(!rd) { src = NULL; break; }
                        skip_fmt_null(&src, " )%n");
                    }
                    else
                        src = NULL;
                }
            }
        }
    }

    if(follow_ellipsis && src)
    {
        // is the argument being followed by an ellipsis?
        const char* src2 = src;
        for(; isspace(*src2); ++src2) ;

        if(!strncmp(src2, "...", 3))
        {
            src = src2;

            // What we need to do is only checking for correctness:
            //  * lhs (left hand sign) and rhs are given
            //  * lhs and rhs must be of the same type
            //  * there must be an "n" such that lhs + n*delta = rhs
            //    => therefore, compute delta
            //  * such "n" must not be 0

            const char* rhssrc = src;
            const char* ellipsis = src;
            src = NULL;
            const char* lhssrc;

            do
            {
                lhssrc = old_src;
                if(is_range_multiplier(lhssrc))
                    lhssrc = strchr(lhssrc, 'x') + 1;

                rtosc_arg_val_t llhsarg, lhsarg, rhsarg;
                char lhstype = deltaless_range_type ? deltaless_range_type
                                                    : *type,
                     llhstype, rhstype[2] = "x";

                *type = '-'; // TODO: bug? return scanned type instead,
                             //       to avoid [0.1 1 ...5]

                size_t zero = 0;
                int llhsskipped, rhsskipped;

                rtosc_arg_val_t delta;

                /*
                 * in all cases, check rhs
                 */
                rhssrc += 2;
                while(isspace(*++rhssrc)) ;

                bool numeric_range  = strchr(numeric_range_types(), lhstype),
                     infinite_range = false;
                const char* endsrc;
                if(*rhssrc == ']')
                {
                    assert(inside_bundle);
                    // we're still not finished. find out if delta-less or not
                    *rhstype = lhstype;
                    endsrc = rhssrc;
                    infinite_range = true;
                }
                else
                {
                    // non-infinite ranges are numeric, so check the type
                    if(!numeric_range)
                        break;

                    endsrc = rtosc_skip_next_printed_arg(rhssrc, &rhsskipped,
                                                         rhstype, NULL, 0,
                                                         inside_bundle);
                    if(!endsrc)
                        break;

                    rtosc_scan_arg_val(rhssrc, &rhsarg, 1, NULL, &zero, 0, 0);
                }

                /*
                 * do not check lhs; it has been checked above
                 */
                if(lhstype != *rhstype)
                {
                    // types must be equal
                    break;
                }

                if(numeric_range)
                    rtosc_scan_arg_val(lhssrc, &lhsarg, 1,
                                       NULL, &zero, 0, 0);

                /*
                 * is llhs given and useful?
                 */
                bool llhsarg_is_useless = false;
                if(llhssrc)
                {
                    const char* next_ellipsis_from_llhssrc =
                            strstr(llhssrc, "...");
                    if(next_ellipsis_from_llhssrc < ellipsis)
                    {
                        llhssrc = next_ellipsis_from_llhssrc + 2;
                        while(isspace(*++llhssrc)) ;
                    }
                    else if(is_range_multiplier(llhssrc))
                    {
                        llhssrc = strchr(llhssrc, 'x') + 1;
                    }

                    rtosc_skip_next_printed_arg(llhssrc,
                                                &llhsskipped, &llhstype,
                                                NULL, 0, inside_bundle);
                    if(types_match(llhstype, lhstype))
                    {
                        rtosc_scan_arg_val(llhssrc, &llhsarg, 1,
                                           NULL, &zero, 0, 0);
                        if(!rtosc_arg_vals_cmp_single(&llhsarg, &lhsarg, NULL))
                        {
                            llhsarg_is_useless = true;
                        }
                        // hint: use rtosc_arg_val_range_arg here if
                        // overlapping ranges (1 ... 5 ... 9) shall be
                        // implemented
                    }
                    else
                    {
                        llhsarg_is_useless = true;
                    }
                }
                else {
                    llhsarg_is_useless = true;
                }

                bool has_delta = true;
                /*
                    compute delta and check if it matches
                */
                if(infinite_range && (llhsarg_is_useless || !numeric_range))
                {
                    has_delta = false;
                }
                else
                {
                    int32_t num = delta_from_arg_vals(&llhsarg, &lhsarg,
                                                      infinite_range ? NULL
                                                                     : &rhsarg,
                                                      &delta,
                                                      llhsarg_is_useless);

                    if(num == -1)
                    {
                        if(infinite_range)
                        {
                            has_delta = false;
                        }
                        else
                        {
                            break;
                        }
                    }
                }

                // if we made it until here, set src to non-NULL
                src = endsrc;

                // ellipsis skips 3 arg vals: range, delta, start
                if(has_delta)
                    ++*skipped;
                ++*skipped;
            } while(false);
        }
    }

    return src;
}